

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cc
# Opt level: O0

void lrit::to_json(json *j,ImageStructureHeader *h)

{
  long in_RSI;
  char (*in_stack_fffffffffffffc68) [13];
  json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  *in_stack_fffffffffffffc70;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *in_stack_fffffffffffffc78;
  json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  *in_stack_fffffffffffffc80;
  initializer_list<nlohmann::detail::json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
  in_stack_fffffffffffffc88;
  value_t in_stack_fffffffffffffcfe;
  undefined1 in_stack_fffffffffffffcff;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *in_stack_fffffffffffffd00;
  initializer_list_t in_stack_fffffffffffffd08;
  undefined1 **local_2c0;
  undefined1 **local_2a8;
  undefined1 **local_290;
  undefined1 **local_278;
  undefined1 **local_260;
  undefined1 *local_230 [8];
  undefined8 *local_1f0;
  undefined8 local_1e8;
  uint local_1dc;
  undefined8 *local_1d8;
  undefined1 *local_1d0 [4];
  undefined1 local_1b0 [32];
  undefined8 *local_190;
  undefined8 local_188;
  uint local_17c;
  undefined8 *local_178;
  undefined1 *local_170 [4];
  undefined1 local_150 [32];
  undefined8 *local_130;
  undefined8 local_128;
  uint local_120;
  undefined8 *local_110;
  undefined1 *local_108 [4];
  undefined1 local_e8 [32];
  undefined8 *local_c8;
  undefined8 local_c0;
  undefined8 *local_b8;
  undefined1 *local_b0 [4];
  undefined1 local_90 [32];
  undefined1 local_70 [32];
  undefined1 local_50 [32];
  undefined8 *local_30;
  undefined8 local_28;
  long local_10;
  
  local_b8 = local_b0;
  local_110 = local_108;
  local_10 = in_RSI;
  nlohmann::detail::
  json_ref<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
  ::json_ref<char_const(&)[13]>(in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
  local_110 = (undefined8 *)local_e8;
  local_120 = (uint)*(byte *)(local_10 + 4);
  nlohmann::detail::
  json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  ::json_ref<int>(in_stack_fffffffffffffc70,(int *)in_stack_fffffffffffffc68);
  local_c8 = local_108;
  local_c0 = 2;
  nlohmann::detail::
  json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  ::json_ref(in_stack_fffffffffffffc80,in_stack_fffffffffffffc88);
  local_b8 = (undefined8 *)local_90;
  local_178 = local_170;
  nlohmann::detail::
  json_ref<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
  ::json_ref<char_const(&)[8]>(in_stack_fffffffffffffc70,(char (*) [8])in_stack_fffffffffffffc68);
  local_178 = (undefined8 *)local_150;
  local_17c = (uint)*(ushort *)(local_10 + 6);
  nlohmann::detail::
  json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  ::json_ref<int>(in_stack_fffffffffffffc70,(int *)in_stack_fffffffffffffc68);
  local_130 = local_170;
  local_128 = 2;
  nlohmann::detail::
  json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  ::json_ref(in_stack_fffffffffffffc80,in_stack_fffffffffffffc88);
  local_b8 = (undefined8 *)local_70;
  local_1d8 = local_1d0;
  nlohmann::detail::
  json_ref<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
  ::json_ref<char_const(&)[6]>(in_stack_fffffffffffffc70,(char (*) [6])in_stack_fffffffffffffc68);
  local_1d8 = (undefined8 *)local_1b0;
  local_1dc = (uint)*(ushort *)(local_10 + 8);
  nlohmann::detail::
  json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  ::json_ref<int>(in_stack_fffffffffffffc70,(int *)in_stack_fffffffffffffc68);
  local_190 = local_1d0;
  local_188 = 2;
  nlohmann::detail::
  json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  ::json_ref(in_stack_fffffffffffffc80,in_stack_fffffffffffffc88);
  local_b8 = (undefined8 *)local_50;
  nlohmann::detail::
  json_ref<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
  ::json_ref<char_const(&)[12]>(in_stack_fffffffffffffc70,(char (*) [12])in_stack_fffffffffffffc68);
  nlohmann::detail::
  json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  ::json_ref<int>(in_stack_fffffffffffffc70,(int *)in_stack_fffffffffffffc68);
  local_1f0 = local_230;
  local_1e8 = 2;
  nlohmann::detail::
  json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  ::json_ref(in_stack_fffffffffffffc80,in_stack_fffffffffffffc88);
  local_30 = local_b0;
  local_28 = 4;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::basic_json(in_stack_fffffffffffffd00,in_stack_fffffffffffffd08,(bool)in_stack_fffffffffffffcff,
               in_stack_fffffffffffffcfe);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::operator=(&in_stack_fffffffffffffc80->owned_value,in_stack_fffffffffffffc78);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::~basic_json(&in_stack_fffffffffffffc70->owned_value);
  local_260 = (undefined1 **)&local_30;
  do {
    local_260 = local_260 + -4;
    nlohmann::detail::
    json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
    ::~json_ref((json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                 *)0x17ceca);
  } while (local_260 != local_b0);
  local_278 = (undefined1 **)&local_1f0;
  do {
    local_278 = local_278 + -4;
    nlohmann::detail::
    json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
    ::~json_ref((json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                 *)0x17cf1c);
  } while (local_278 != local_230);
  local_290 = (undefined1 **)&local_190;
  do {
    local_290 = local_290 + -4;
    nlohmann::detail::
    json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
    ::~json_ref((json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                 *)0x17cf6e);
  } while (local_290 != local_1d0);
  local_2a8 = (undefined1 **)&local_130;
  do {
    local_2a8 = local_2a8 + -4;
    nlohmann::detail::
    json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
    ::~json_ref((json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                 *)0x17cfc0);
  } while (local_2a8 != local_170);
  local_2c0 = (undefined1 **)&local_c8;
  do {
    local_2c0 = local_2c0 + -4;
    nlohmann::detail::
    json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
    ::~json_ref((json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                 *)0x17d012);
  } while (local_2c0 != local_108);
  return;
}

Assistant:

void to_json(json& j, const ImageStructureHeader& h) {
  j = {
      {"BitsPerPixel", int(h.bitsPerPixel)},
      {"Columns", int(h.columns)},
      {"Lines", int(h.lines)},
      {"Compression", int(h.compression)},
  };
}